

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cache.cpp
# Opt level: O3

void __thiscall Cache::initCache(Cache *this)

{
  uint uVar1;
  uint uVar2;
  pointer puVar3;
  ulong uVar4;
  int **ppiVar5;
  int *piVar6;
  uint64_t **ppuVar7;
  uint64_t *puVar8;
  uint32_t j;
  pointer pBVar9;
  ulong uVar10;
  ulong uVar11;
  allocator_type local_69;
  undefined1 local_68 [16];
  pointer local_58;
  vector<Cache::Block,_std::allocator<Cache::Block>_> local_48;
  
  std::vector<Cache::Block,_std::allocator<Cache::Block>_>::vector
            (&local_48,(ulong)(this->policy).block_num,&local_69);
  local_58 = (this->blocks).super__Vector_base<Cache::Block,_std::allocator<Cache::Block>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  (this->blocks).super__Vector_base<Cache::Block,_std::allocator<Cache::Block>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_48.super__Vector_base<Cache::Block,_std::allocator<Cache::Block>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_68._0_8_ =
       (this->blocks).super__Vector_base<Cache::Block,_std::allocator<Cache::Block>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_68._8_8_ =
       (this->blocks).super__Vector_base<Cache::Block,_std::allocator<Cache::Block>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (this->blocks).super__Vector_base<Cache::Block,_std::allocator<Cache::Block>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_48.super__Vector_base<Cache::Block,_std::allocator<Cache::Block>_>._M_impl.
       super__Vector_impl_data._M_start;
  (this->blocks).super__Vector_base<Cache::Block,_std::allocator<Cache::Block>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_48.super__Vector_base<Cache::Block,_std::allocator<Cache::Block>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_48.super__Vector_base<Cache::Block,_std::allocator<Cache::Block>_>._M_impl.
  super__Vector_impl_data._0_16_ = ZEXT816(0) << 0x20;
  local_48.super__Vector_base<Cache::Block,_std::allocator<Cache::Block>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<Cache::Block,_std::allocator<Cache::Block>_>::~vector
            ((vector<Cache::Block,_std::allocator<Cache::Block>_> *)local_68);
  std::vector<Cache::Block,_std::allocator<Cache::Block>_>::~vector(&local_48);
  pBVar9 = (this->blocks).super__Vector_base<Cache::Block,_std::allocator<Cache::Block>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->blocks).super__Vector_base<Cache::Block,_std::allocator<Cache::Block>_>._M_impl.
      super__Vector_impl_data._M_finish != pBVar9) {
    uVar10 = 0;
    do {
      uVar1 = (this->policy).block_size;
      pBVar9[uVar10].size = uVar1;
      pBVar9[uVar10].id = (uint32_t)(uVar10 / (this->policy).associativity);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_68,(ulong)uVar1,
                 (allocator_type *)&local_48);
      puVar3 = pBVar9[uVar10].data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pBVar9[uVar10].data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)local_68._0_8_;
      pBVar9[uVar10].data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)local_68._8_8_;
      local_68 = ZEXT816(0) << 0x20;
      pBVar9[uVar10].data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = &local_58->valid;
      local_58 = (pointer)0x0;
      if (puVar3 != (pointer)0x0) {
        operator_delete(puVar3);
        if ((pointer)local_68._0_8_ != (pointer)0x0) {
          operator_delete((void *)local_68._0_8_);
        }
      }
      pBVar9 = (this->blocks).super__Vector_base<Cache::Block,_std::allocator<Cache::Block>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar10 = (ulong)((int)uVar10 + 1);
      uVar4 = ((long)(this->blocks).super__Vector_base<Cache::Block,_std::allocator<Cache::Block>_>.
                     _M_impl.super__Vector_impl_data._M_finish - (long)pBVar9 >> 4) *
              -0x5555555555555555;
    } while (uVar10 <= uVar4 && uVar4 - uVar10 != 0);
  }
  uVar1 = (this->policy).block_num;
  uVar2 = (this->policy).associativity;
  uVar11 = (ulong)uVar2;
  uVar4 = uVar1 / uVar11;
  uVar10 = uVar4 * 8;
  ppiVar5 = (int **)operator_new__(uVar10);
  this->plru_bit = ppiVar5;
  if (uVar2 <= uVar1) {
    uVar10 = 0;
    do {
      piVar6 = (int *)operator_new__(uVar11 << 2);
      this->plru_bit[uVar10] = piVar6;
      uVar4 = 0;
      piVar6 = this->plru_bit[uVar10];
      do {
        piVar6[uVar4] = 0;
        uVar4 = uVar4 + 1;
        uVar11 = (ulong)(this->policy).associativity;
      } while (uVar4 < uVar11);
      uVar10 = uVar10 + 1;
      uVar4 = (this->policy).block_num / uVar11;
    } while (uVar10 < uVar4);
    uVar10 = uVar4 * 8;
  }
  ppuVar7 = (uint64_t **)operator_new__(uVar10);
  this->mct = ppuVar7;
  if ((int)uVar4 != 0) {
    uVar1 = this->mct_size;
    uVar10 = 0;
    uVar11 = (ulong)uVar1 << 3;
    do {
      puVar8 = (uint64_t *)operator_new__(uVar11);
      this->mct[uVar10] = puVar8;
      if (uVar1 != 0) {
        memset(this->mct[uVar10],0xff,uVar11);
      }
      uVar10 = uVar10 + 1;
    } while (uVar4 != uVar10);
  }
  return;
}

Assistant:

void Cache::initCache() {
    this->blocks = std::vector<Block>(policy.block_num);
    for (uint32_t i = 0; i < this->blocks.size(); i++) {
        Block &b = this->blocks[i];
        b.size = policy.block_size;
        b.id = i / policy.associativity;
        b.data = std::vector<uint8_t>(b.size);
    }
    this->plru_bit = new int *[this->policy.block_num / this->policy.associativity];
    for (uint32_t i = 0; i < this->policy.block_num / this->policy.associativity; i++) {
        this->plru_bit[i] = new int[this->policy.associativity];
        for (uint32_t j = 0; j < this->policy.associativity; j++) {
            this->plru_bit[i][j] = 0;
        }
    }
    this->mct = new uint64_t *[this->policy.block_num / this->policy.associativity];
    for (uint32_t i = 0; i < this->policy.block_num / this->policy.associativity; i++) {
        this->mct[i] = new uint64_t[this->mct_size];
        for (uint32_t j = 0; j < this->mct_size; j++) {
            this->mct[i][j] = (uint64_t) -1;
        }
    }

}